

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O2

void Fire(int Cooling,int Sparking,int SpeedDelay)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  int i;
  long lVar5;
  int j;
  
  for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 1) {
    iVar1 = myRandom(0,(Cooling * 10) / 0x18 + 2);
    bVar4 = Fire::heat[lVar5] - (char)iVar1;
    if ((int)(uint)Fire::heat[lVar5] < iVar1) {
      bVar4 = '\0';
    }
    Fire::heat[lVar5] = bVar4;
  }
  for (uVar3 = 0x17; 1 < uVar3; uVar3 = uVar3 - 1) {
    Fire::heat[uVar3] =
         (byte)(((uint)*(byte *)(uVar3 + 0x1071af) + (uint)*(byte *)(uVar3 + 0x1071ae) * 2) / 3);
  }
  iVar1 = myRandom(0,0xff);
  if (iVar1 < Sparking) {
    iVar1 = myRandom(0,7);
    bVar4 = Fire::heat[iVar1];
    iVar2 = myRandom(0xa0,0xff);
    Fire::heat[iVar1] = (char)iVar2 + bVar4;
  }
  for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 1) {
    setPixelHeatColor((int)lVar5,Fire::heat[lVar5]);
  }
  showStrip();
  delay(SpeedDelay);
  return;
}

Assistant:

void Fire(int Cooling, int Sparking, int SpeedDelay) {
    static byte heat[NUM_LEDS];
    int cooldown;

    // Step 1.  Cool down every cell a little
    for( int i = 0; i < NUM_LEDS; i++) {
        cooldown = myRandom(0, ((Cooling * 10) / NUM_LEDS) + 2);

        if(cooldown>heat[i]) {
            heat[i]=0;
        } else {
            heat[i]=heat[i]-cooldown;
        }
    }

    // Step 2.  Heat from each cell drifts 'up' and diffuses a little
    for( int k= NUM_LEDS - 1; k >= 2; k--) {
        heat[k] = (heat[k - 1] + heat[k - 2] + heat[k - 2]) / 3;
    }

    // Step 3.  Randomly ignite new 'sparks' near the bottom
    if( myRandom(0, 255) < Sparking ) {
        int y = myRandom(0, 7);
        heat[y] = heat[y] + myRandom(160,255);
        //heat[y] = random(160,255);
    }

    // Step 4.  Convert heat to LED colors
    for( int j = 0; j < NUM_LEDS; j++) {
        setPixelHeatColor(j, heat[j] );
    }

    showStrip();
    delay(SpeedDelay);
}